

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

bool __thiscall
wabt::anon_unknown_7::Validator::CheckHasTable(Validator *this,Location *loc,Opcode opcode)

{
  char *pcVar1;
  Module *extraout_RAX;
  Module *pMVar2;
  Opcode local_1c [2];
  Opcode opcode_local;
  
  pMVar2 = this->current_module_;
  if ((pMVar2->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (pMVar2->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_1c[0].enum_ = opcode.enum_;
    pcVar1 = Opcode::GetName(local_1c);
    PrintError(this,loc,"%s requires an imported or defined table.",pcVar1);
    pMVar2 = extraout_RAX;
  }
  return SUB81(pMVar2,0);
}

Assistant:

bool Validator::CheckHasTable(const Location* loc, Opcode opcode) {
  if (current_module_->tables.size() == 0) {
    PrintError(loc, "%s requires an imported or defined table.",
               opcode.GetName());
    return false;
  }

  return true;
}